

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

void load_GL_OES_byte_coordinates(GLADloadproc load)

{
  if (GLAD_GL_OES_byte_coordinates != 0) {
    glad_glMultiTexCoord1bOES = (PFNGLMULTITEXCOORD1BOESPROC)(*load)("glMultiTexCoord1bOES");
    glad_glMultiTexCoord1bvOES = (PFNGLMULTITEXCOORD1BVOESPROC)(*load)("glMultiTexCoord1bvOES");
    glad_glMultiTexCoord2bOES = (PFNGLMULTITEXCOORD2BOESPROC)(*load)("glMultiTexCoord2bOES");
    glad_glMultiTexCoord2bvOES = (PFNGLMULTITEXCOORD2BVOESPROC)(*load)("glMultiTexCoord2bvOES");
    glad_glMultiTexCoord3bOES = (PFNGLMULTITEXCOORD3BOESPROC)(*load)("glMultiTexCoord3bOES");
    glad_glMultiTexCoord3bvOES = (PFNGLMULTITEXCOORD3BVOESPROC)(*load)("glMultiTexCoord3bvOES");
    glad_glMultiTexCoord4bOES = (PFNGLMULTITEXCOORD4BOESPROC)(*load)("glMultiTexCoord4bOES");
    glad_glMultiTexCoord4bvOES = (PFNGLMULTITEXCOORD4BVOESPROC)(*load)("glMultiTexCoord4bvOES");
    glad_glTexCoord1bOES = (PFNGLTEXCOORD1BOESPROC)(*load)("glTexCoord1bOES");
    glad_glTexCoord1bvOES = (PFNGLTEXCOORD1BVOESPROC)(*load)("glTexCoord1bvOES");
    glad_glTexCoord2bOES = (PFNGLTEXCOORD2BOESPROC)(*load)("glTexCoord2bOES");
    glad_glTexCoord2bvOES = (PFNGLTEXCOORD2BVOESPROC)(*load)("glTexCoord2bvOES");
    glad_glTexCoord3bOES = (PFNGLTEXCOORD3BOESPROC)(*load)("glTexCoord3bOES");
    glad_glTexCoord3bvOES = (PFNGLTEXCOORD3BVOESPROC)(*load)("glTexCoord3bvOES");
    glad_glTexCoord4bOES = (PFNGLTEXCOORD4BOESPROC)(*load)("glTexCoord4bOES");
    glad_glTexCoord4bvOES = (PFNGLTEXCOORD4BVOESPROC)(*load)("glTexCoord4bvOES");
    glad_glVertex2bOES = (PFNGLVERTEX2BOESPROC)(*load)("glVertex2bOES");
    glad_glVertex2bvOES = (PFNGLVERTEX2BVOESPROC)(*load)("glVertex2bvOES");
    glad_glVertex3bOES = (PFNGLVERTEX3BOESPROC)(*load)("glVertex3bOES");
    glad_glVertex3bvOES = (PFNGLVERTEX3BVOESPROC)(*load)("glVertex3bvOES");
    glad_glVertex4bOES = (PFNGLVERTEX4BOESPROC)(*load)("glVertex4bOES");
    glad_glVertex4bvOES = (PFNGLVERTEX4BVOESPROC)(*load)("glVertex4bvOES");
  }
  return;
}

Assistant:

static void load_GL_OES_byte_coordinates(GLADloadproc load) {
	if(!GLAD_GL_OES_byte_coordinates) return;
	glad_glMultiTexCoord1bOES = (PFNGLMULTITEXCOORD1BOESPROC)load("glMultiTexCoord1bOES");
	glad_glMultiTexCoord1bvOES = (PFNGLMULTITEXCOORD1BVOESPROC)load("glMultiTexCoord1bvOES");
	glad_glMultiTexCoord2bOES = (PFNGLMULTITEXCOORD2BOESPROC)load("glMultiTexCoord2bOES");
	glad_glMultiTexCoord2bvOES = (PFNGLMULTITEXCOORD2BVOESPROC)load("glMultiTexCoord2bvOES");
	glad_glMultiTexCoord3bOES = (PFNGLMULTITEXCOORD3BOESPROC)load("glMultiTexCoord3bOES");
	glad_glMultiTexCoord3bvOES = (PFNGLMULTITEXCOORD3BVOESPROC)load("glMultiTexCoord3bvOES");
	glad_glMultiTexCoord4bOES = (PFNGLMULTITEXCOORD4BOESPROC)load("glMultiTexCoord4bOES");
	glad_glMultiTexCoord4bvOES = (PFNGLMULTITEXCOORD4BVOESPROC)load("glMultiTexCoord4bvOES");
	glad_glTexCoord1bOES = (PFNGLTEXCOORD1BOESPROC)load("glTexCoord1bOES");
	glad_glTexCoord1bvOES = (PFNGLTEXCOORD1BVOESPROC)load("glTexCoord1bvOES");
	glad_glTexCoord2bOES = (PFNGLTEXCOORD2BOESPROC)load("glTexCoord2bOES");
	glad_glTexCoord2bvOES = (PFNGLTEXCOORD2BVOESPROC)load("glTexCoord2bvOES");
	glad_glTexCoord3bOES = (PFNGLTEXCOORD3BOESPROC)load("glTexCoord3bOES");
	glad_glTexCoord3bvOES = (PFNGLTEXCOORD3BVOESPROC)load("glTexCoord3bvOES");
	glad_glTexCoord4bOES = (PFNGLTEXCOORD4BOESPROC)load("glTexCoord4bOES");
	glad_glTexCoord4bvOES = (PFNGLTEXCOORD4BVOESPROC)load("glTexCoord4bvOES");
	glad_glVertex2bOES = (PFNGLVERTEX2BOESPROC)load("glVertex2bOES");
	glad_glVertex2bvOES = (PFNGLVERTEX2BVOESPROC)load("glVertex2bvOES");
	glad_glVertex3bOES = (PFNGLVERTEX3BOESPROC)load("glVertex3bOES");
	glad_glVertex3bvOES = (PFNGLVERTEX3BVOESPROC)load("glVertex3bvOES");
	glad_glVertex4bOES = (PFNGLVERTEX4BOESPROC)load("glVertex4bOES");
	glad_glVertex4bvOES = (PFNGLVERTEX4BVOESPROC)load("glVertex4bvOES");
}